

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O3

int __thiscall
QCborContainerPrivate::stringCompareElement<QStringView>
          (QCborContainerPrivate *this,Element *e,QStringView s,Comparison mode)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  long *plVar6;
  QByteArrayView utf8;
  QStringView lhs;
  QStringView lhs_00;
  
  lVar4 = s.m_size;
  if (e->type == String) {
    uVar1._0_4_ = e->type;
    uVar1._4_4_ = e->flags;
    pcVar5 = (this->data).d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    if ((uVar1 >> 0x21 & 1) == 0) {
      return -(uint)(lVar4 != 0);
    }
    plVar6 = (long *)(pcVar5 + (e->field_0).value);
    if ((uVar1 >> 0x22 & 1) == 0) {
      utf8.m_data = plVar6 + 1;
      utf8.m_size = *plVar6;
      iVar3 = QUtf8::compareUtf8(utf8,s,CaseSensitive);
      return iVar3;
    }
    if (mode != ForEquality) {
      lhs.m_data = (storage_type_conflict *)(plVar6 + 1);
      lhs.m_size = *plVar6 / 2;
      iVar3 = QtPrivate::compareStrings(lhs,s,CaseSensitive);
      return iVar3;
    }
    iVar3 = 1;
    if (*plVar6 / 2 == lVar4) {
      lhs_00.m_data = (storage_type_conflict *)(plVar6 + 1);
      lhs_00.m_size = lVar4;
      bVar2 = QtPrivate::equalStrings(lhs_00,s);
      return (int)!bVar2;
    }
  }
  else {
    iVar3 = e->type + 0xffffffa0;
  }
  return iVar3;
}

Assistant:

int stringCompareElement(const QtCbor::Element &e, String s, QtCbor::Comparison mode) const
    {
        if (e.type != QCborValue::String)
            return int(e.type) - int(QCborValue::String);

        const QtCbor::ByteData *b = byteData(e);
        if (!b)
            return s.isEmpty() ? 0 : -1;

        if (e.flags & QtCbor::Element::StringIsUtf16) {
            if (mode == QtCbor::Comparison::ForEquality)
                return b->asStringView() == s ? 0 : 1;
            return b->asStringView().compare(s);
        }
        return compareUtf8(b, s);
    }